

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::not_connected_in_underlying_graph
          (Proof *this,vector<int,_std::allocator<int>_> *x,int y)

{
  bool bVar1;
  type pbVar2;
  ostream *poVar3;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *pmVar4;
  pointer pIVar5;
  int in_EDX;
  key_type_conflict1 *in_RSI;
  int *v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  key_type_conflict1 *in_stack_ffffffffffffffd8;
  
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x190dd1);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffffa0);
  poVar3 = std::operator<<(pbVar2,"u 1 ~x");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x190dfe);
  this_00 = (map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(long)in_EDX;
  pmVar4 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,in_stack_ffffffffffffffd8);
  std::operator<<(poVar3,(string *)pmVar4);
  local_30._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_30);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x190e84);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = std::operator<<(pbVar2," 1 ~x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x190eb1);
    pmVar4 = std::
             map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,in_RSI);
    std::operator<<(in_stack_ffffffffffffffa0,(string *)pmVar4);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x190ef8);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffffa0);
  std::operator<<(pbVar2," >= 1 ;\n");
  pIVar5 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x190f20);
  pIVar5->proof_line = pIVar5->proof_line + 1;
  return;
}

Assistant:

auto Proof::not_connected_in_underlying_graph(const std::vector<int> & x, int y) -> void
{
    *_imp->proof_stream << "u 1 ~x" << _imp->binary_variable_mappings[y];
    for (auto & v : x)
        *_imp->proof_stream << " 1 ~x" << _imp->binary_variable_mappings[v];
    *_imp->proof_stream << " >= 1 ;\n";
    ++_imp->proof_line;
}